

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O2

void google::protobuf::MapTestUtil::SetMapFields<proto2_unittest::TestMap>(TestMap *message)

{
  MapField<proto2_unittest::TestMap_MapInt64Int64Entry_DoNotUse,_long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
  *this;
  MapField<proto2_unittest::TestMap_MapUint32Uint32Entry_DoNotUse,_unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
  *this_00;
  MapField<proto2_unittest::TestMap_MapStringStringEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *this_01;
  Map<int,_int> *pMVar1;
  int *piVar2;
  Map<long,_long> *pMVar3;
  long *plVar4;
  Map<unsigned_int,_unsigned_int> *pMVar5;
  uint *puVar6;
  Map<unsigned_long,_unsigned_long> *pMVar7;
  unsigned_long *puVar8;
  Map<int,_float> *pMVar9;
  float *pfVar10;
  Map<int,_double> *pMVar11;
  double *pdVar12;
  Map<bool,_bool> *pMVar13;
  bool *pbVar14;
  Map<std::__cxx11::string,std::__cxx11::string> *pMVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar17;
  Map<int,_proto2_unittest::MapEnum> *pMVar18;
  MapEnum *pMVar19;
  Map<int,_proto2_unittest::ForeignMessage> *pMVar20;
  ForeignMessage *pFVar21;
  MapField<proto2_unittest::TestMap_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_02;
  undefined8 local_d8;
  key_arg<std::__cxx11::basic_string<char>_> local_b8;
  TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum> *local_98;
  TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  TypeDefinedMapFieldBase<bool,_bool> *local_80;
  TypeDefinedMapFieldBase<int,_double> *local_78;
  TypeDefinedMapFieldBase<int,_float> *local_70;
  TypeDefinedMapFieldBase<long,_long> *local_68;
  TypeDefinedMapFieldBase<int,_int> *local_60;
  TypeDefinedMapFieldBase<unsigned_long,_unsigned_long> *local_58;
  TypeDefinedMapFieldBase<unsigned_int,_unsigned_int> *local_50;
  TypeDefinedMapFieldBase<long,_long> *local_48;
  TypeDefinedMapFieldBase<int,_int> *local_40;
  TypeDefinedMapFieldBase<unsigned_long,_unsigned_long> *local_38;
  
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap
                     ((TypeDefinedMapFieldBase<int,_int> *)&(message->field_0)._impl_);
  local_d8 = (ulong)local_d8._4_4_ << 0x20;
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 0;
  this = &(message->field_0)._impl_.map_int64_int64_;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap
                     (&this->super_TypeDefinedMapFieldBase<long,_long>);
  local_d8 = 0;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 0;
  this_00 = &(message->field_0)._impl_.map_uint32_uint32_;
  pMVar5 = internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (&this_00->super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>);
  local_d8 = local_d8 & 0xffffffff00000000;
  puVar6 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     (pMVar5,(key_arg<unsigned_int> *)&local_d8);
  *puVar6 = 0;
  local_38 = &(message->field_0)._impl_.map_uint64_uint64_.
              super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>;
  pMVar7 = internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap(local_38);
  local_d8 = 0;
  puVar8 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar7,&local_d8);
  *puVar8 = 0;
  local_40 = &(message->field_0)._impl_.map_sint32_sint32_.super_TypeDefinedMapFieldBase<int,_int>;
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_40);
  local_d8 = local_d8 & 0xffffffff00000000;
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 0;
  local_48 = &(message->field_0)._impl_.map_sint64_sint64_.super_TypeDefinedMapFieldBase<long,_long>
  ;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_48);
  local_d8 = 0;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 0;
  local_50 = &(message->field_0)._impl_.map_fixed32_fixed32_.
              super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>;
  pMVar5 = internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap(local_50);
  local_d8 = local_d8 & 0xffffffff00000000;
  puVar6 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     (pMVar5,(key_arg<unsigned_int> *)&local_d8);
  *puVar6 = 0;
  local_58 = &(message->field_0)._impl_.map_fixed64_fixed64_.
              super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>;
  pMVar7 = internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap(local_58);
  local_d8 = 0;
  puVar8 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar7,&local_d8);
  *puVar8 = 0;
  local_60 = &(message->field_0)._impl_.map_sfixed32_sfixed32_.
              super_TypeDefinedMapFieldBase<int,_int>;
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_60);
  local_d8 = local_d8 & 0xffffffff00000000;
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 0;
  local_68 = &(message->field_0)._impl_.map_sfixed64_sfixed64_.
              super_TypeDefinedMapFieldBase<long,_long>;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_68);
  local_d8 = 0;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 0;
  local_70 = &(message->field_0)._impl_.map_int32_float_.super_TypeDefinedMapFieldBase<int,_float>;
  pMVar9 = internal::TypeDefinedMapFieldBase<int,_float>::MutableMap(local_70);
  local_d8 = local_d8 & 0xffffffff00000000;
  pfVar10 = Map<int,_float>::operator[]<int>(pMVar9,(key_arg<int> *)&local_d8);
  *pfVar10 = 0.0;
  local_78 = &(message->field_0)._impl_.map_int32_double_.super_TypeDefinedMapFieldBase<int,_double>
  ;
  pMVar11 = internal::TypeDefinedMapFieldBase<int,_double>::MutableMap(local_78);
  local_d8 = local_d8 & 0xffffffff00000000;
  pdVar12 = Map<int,_double>::operator[]<int>(pMVar11,(key_arg<int> *)&local_d8);
  *pdVar12 = 0.0;
  local_80 = &(message->field_0)._impl_.map_bool_bool_.super_TypeDefinedMapFieldBase<bool,_bool>;
  pMVar13 = internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap(local_80);
  local_d8 = local_d8 & 0xffffffffffffff00;
  pbVar14 = Map<bool,_bool>::operator[]<bool>(pMVar13,(key_arg<bool> *)&local_d8);
  *pbVar14 = false;
  long_string_abi_cxx11_();
  this_01 = &(message->field_0)._impl_.map_string_string_;
  pMVar15 = (Map<std::__cxx11::string,std::__cxx11::string> *)
            internal::
            TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableMap(&this_01->
                          super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        );
  long_string_abi_cxx11_();
  pbVar16 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                      (pMVar15,&local_b8);
  local_88 = &this_01->
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  std::__cxx11::string::operator=((string *)pbVar16,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  long_string_abi_cxx11_();
  local_90 = &(message->field_0)._impl_.map_int32_bytes_.
              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  pMVar17 = internal::
            TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableMap(local_90);
  local_b8._M_dataplus._M_p._0_4_ = 0;
  pbVar16 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]<int>(pMVar17,(key_arg<int> *)&local_b8);
  std::__cxx11::string::operator=((string *)pbVar16,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_98 = &(message->field_0)._impl_.map_int32_enum_.
              super_TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>;
  pMVar18 = internal::TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>::MutableMap(local_98);
  local_d8 = local_d8 & 0xffffffff00000000;
  pMVar19 = Map<int,_proto2_unittest::MapEnum>::operator[]<int>(pMVar18,(key_arg<int> *)&local_d8);
  *pMVar19 = MAP_ENUM_BAR;
  this_02 = &(message->field_0)._impl_.map_int32_foreign_message_;
  pMVar20 = internal::TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>::MutableMap
                      (&this_02->super_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>
                      );
  local_d8 = local_d8 & 0xffffffff00000000;
  pFVar21 = Map<int,_proto2_unittest::ForeignMessage>::operator[]<int>
                      (pMVar20,(key_arg<int> *)&local_d8);
  (pFVar21->field_0)._impl_.c_ = 0;
  *(byte *)&pFVar21->field_0 = *(byte *)&pFVar21->field_0 | 1;
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap
                     ((TypeDefinedMapFieldBase<int,_int> *)&(message->field_0)._impl_);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 1;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap
                     (&this->super_TypeDefinedMapFieldBase<long,_long>);
  local_d8 = 1;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 1;
  pMVar5 = internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap
                     (&this_00->super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  puVar6 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     (pMVar5,(key_arg<unsigned_int> *)&local_d8);
  *puVar6 = 1;
  pMVar7 = internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap(local_38);
  local_d8 = 1;
  puVar8 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar7,&local_d8);
  *puVar8 = 1;
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_40);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 1;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_48);
  local_d8 = 1;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 1;
  pMVar5 = internal::TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>::MutableMap(local_50);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  puVar6 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>
                     (pMVar5,(key_arg<unsigned_int> *)&local_d8);
  *puVar6 = 1;
  pMVar7 = internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap(local_58);
  local_d8 = 1;
  puVar8 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar7,&local_d8);
  *puVar8 = 1;
  pMVar1 = internal::TypeDefinedMapFieldBase<int,_int>::MutableMap(local_60);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  piVar2 = Map<int,_int>::operator[]<int>(pMVar1,(key_arg<int> *)&local_d8);
  *piVar2 = 1;
  pMVar3 = internal::TypeDefinedMapFieldBase<long,_long>::MutableMap(local_68);
  local_d8 = 1;
  plVar4 = Map<long,_long>::operator[]<long>(pMVar3,&local_d8);
  *plVar4 = 1;
  pMVar9 = internal::TypeDefinedMapFieldBase<int,_float>::MutableMap(local_70);
  local_d8._0_4_ = 1;
  pfVar10 = Map<int,_float>::operator[]<int>(pMVar9,(key_arg<int> *)&local_d8);
  *pfVar10 = 1.0;
  pMVar11 = internal::TypeDefinedMapFieldBase<int,_double>::MutableMap(local_78);
  local_d8 = CONCAT44(local_d8._4_4_,1);
  pdVar12 = Map<int,_double>::operator[]<int>(pMVar11,(key_arg<int> *)&local_d8);
  *pdVar12 = 1.0;
  pMVar13 = internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap(local_80);
  local_d8 = CONCAT71(local_d8._1_7_,1);
  pbVar14 = Map<bool,_bool>::operator[]<bool>(pMVar13,(key_arg<bool> *)&local_d8);
  *pbVar14 = true;
  long_string_2_abi_cxx11_();
  pMVar15 = (Map<std::__cxx11::string,std::__cxx11::string> *)
            internal::
            TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableMap(local_88);
  long_string_2_abi_cxx11_();
  pbVar16 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                      (pMVar15,&local_b8);
  std::__cxx11::string::operator=((string *)pbVar16,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  long_string_2_abi_cxx11_();
  pMVar17 = internal::
            TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MutableMap(local_90);
  local_b8._M_dataplus._M_p._0_4_ = 1;
  pbVar16 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]<int>(pMVar17,(key_arg<int> *)&local_b8);
  std::__cxx11::string::operator=((string *)pbVar16,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  pMVar18 = internal::TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>::MutableMap(local_98);
  local_d8._0_4_ = 1;
  pMVar19 = Map<int,_proto2_unittest::MapEnum>::operator[]<int>(pMVar18,(key_arg<int> *)&local_d8);
  *pMVar19 = MAP_ENUM_BAZ;
  pMVar20 = internal::TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>::MutableMap
                      (&this_02->super_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>
                      );
  local_d8 = CONCAT44(local_d8._4_4_,1);
  pFVar21 = Map<int,_proto2_unittest::ForeignMessage>::operator[]<int>
                      (pMVar20,(key_arg<int> *)&local_d8);
  (pFVar21->field_0)._impl_.c_ = 1;
  *(byte *)&pFVar21->field_0 = *(byte *)&pFVar21->field_0 | 1;
  return;
}

Assistant:

void MapTestUtil::SetMapFields(TestMap* message) {
  // Add first element.
  (*message->mutable_map_int32_int32())[0] = 0;
  (*message->mutable_map_int64_int64())[0] = 0;
  (*message->mutable_map_uint32_uint32())[0] = 0;
  (*message->mutable_map_uint64_uint64())[0] = 0;
  (*message->mutable_map_sint32_sint32())[0] = 0;
  (*message->mutable_map_sint64_sint64())[0] = 0;
  (*message->mutable_map_fixed32_fixed32())[0] = 0;
  (*message->mutable_map_fixed64_fixed64())[0] = 0;
  (*message->mutable_map_sfixed32_sfixed32())[0] = 0;
  (*message->mutable_map_sfixed64_sfixed64())[0] = 0;
  (*message->mutable_map_int32_float())[0] = 0.0;
  (*message->mutable_map_int32_double())[0] = 0.0;
  (*message->mutable_map_bool_bool())[0] = false;
  (*message->mutable_map_string_string())[long_string()] = long_string();
  (*message->mutable_map_int32_bytes())[0] = long_string();
  (*message->mutable_map_int32_enum())[0] = MapEnum_BAR<TestMap>();
  (*message->mutable_map_int32_foreign_message())[0].set_c(0);

  // Add second element
  (*message->mutable_map_int32_int32())[1] = 1;
  (*message->mutable_map_int64_int64())[1] = 1;
  (*message->mutable_map_uint32_uint32())[1] = 1;
  (*message->mutable_map_uint64_uint64())[1] = 1;
  (*message->mutable_map_sint32_sint32())[1] = 1;
  (*message->mutable_map_sint64_sint64())[1] = 1;
  (*message->mutable_map_fixed32_fixed32())[1] = 1;
  (*message->mutable_map_fixed64_fixed64())[1] = 1;
  (*message->mutable_map_sfixed32_sfixed32())[1] = 1;
  (*message->mutable_map_sfixed64_sfixed64())[1] = 1;
  (*message->mutable_map_int32_float())[1] = 1.0;
  (*message->mutable_map_int32_double())[1] = 1.0;
  (*message->mutable_map_bool_bool())[1] = true;
  (*message->mutable_map_string_string())[long_string_2()] = long_string_2();
  (*message->mutable_map_int32_bytes())[1] = long_string_2();
  (*message->mutable_map_int32_enum())[1] = MapEnum_BAZ<TestMap>();
  (*message->mutable_map_int32_foreign_message())[1].set_c(1);
}